

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lecturedemodof.cc
# Opt level: O3

void lecturedemo::printDofInfo(DofHandler *dofh)

{
  Entity *pEVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  undefined4 extraout_var;
  long extraout_RDX;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  shared_ptr<const_lf::mesh::Mesh> mesh;
  char local_71;
  ulong local_70;
  DofHandler *local_68;
  uint local_5c;
  long *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  Entity *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  
  (*dofh->_vptr_DofHandler[8])(&local_58,dofh);
  local_5c = (*dofh->_vptr_DofHandler[2])(dofh);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DofHandler(",0xb);
  (*dofh->_vptr_DofHandler[2])(dofh);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," dofs):",7);
  local_71 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_71,1);
  local_70 = 0;
  local_68 = dofh;
  while( true ) {
    uVar2 = (**(code **)*local_58)();
    if (uVar2 < (uint)local_70) break;
    auVar9 = (**(code **)(*local_58 + 0x10))();
    puVar5 = auVar9._0_8_;
    if (auVar9._8_8_ != 0) {
      local_40 = puVar5 + auVar9._8_8_;
      do {
        pEVar1 = (Entity *)*puVar5;
        local_38 = puVar5;
        (**(code **)(*local_58 + 0x28))(local_58,pEVar1);
        uVar2 = (*dofh->_vptr_DofHandler[3])(dofh,pEVar1);
        local_48 = pEVar1;
        (*dofh->_vptr_DofHandler[5])(dofh);
        poVar4 = lf::mesh::operator<<((ostream *)&std::cout,local_48);
        local_71 = ' ';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_71,1);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," dofs = [",9);
        if (uVar2 != 0) {
          uVar6 = 0;
          do {
            poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
            local_71 = ' ';
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_71,1);
            uVar6 = uVar6 + 1;
          } while (uVar2 != uVar6);
        }
        local_71 = ']';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_71,1);
        (*local_68->_vptr_DofHandler[6])(local_68,local_48);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," int = [",8);
        if (extraout_RDX != 0) {
          lVar7 = 0;
          do {
            poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
            local_71 = ' ';
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_71,1);
            lVar7 = lVar7 + 8;
          } while (extraout_RDX << 3 != lVar7);
        }
        local_71 = ']';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,&local_71,1);
        local_71 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_71,1);
        puVar5 = local_38 + 1;
        dofh = local_68;
      } while (puVar5 != local_40);
    }
    local_70 = (ulong)((int)local_70 + 1);
  }
  if (local_5c != 0) {
    uVar6 = (ulong)local_5c;
    uVar8 = 0;
    do {
      iVar3 = (*local_68->_vptr_DofHandler[7])(local_68,uVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"dof ",4);
      poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
      poVar4 = lf::mesh::operator<<(poVar4,(Entity *)CONCAT44(extraout_var,iVar3));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      (**(code **)(*local_58 + 0x28))(local_58,(Entity *)CONCAT44(extraout_var,iVar3));
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      local_71 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_71,1);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return;
}

Assistant:

void printDofInfo(const lf::assemble::DofHandler &dofh) {
  // Obtain pointer to the underlying mesh
  auto mesh = dofh.Mesh();
  // Number of degrees of freedom managed by the DofHandler object
  const lf::assemble::size_type N_dofs(dofh.NumDofs());
  std::cout << "DofHandler(" << dofh.NumDofs() << " dofs):" << '\n';
  // Output information about dofs for entities of all co-dimensions
  for (lf::base::dim_t codim = 0; codim <= mesh->DimMesh(); codim++) {
    // Visit all entities of a codimension codim
    for (const lf::mesh::Entity* e : mesh->Entities(codim)) {
      // Fetch unique index of current entity supplied by mesh object
      const lf::base::glb_idx_t e_idx = mesh->Index(*e);
      // Number of shape functions covering current entity
      const lf::assemble::size_type no_dofs(dofh.NumLocalDofs(*e));
      // Obtain global indices of those shape functions ...
      const std::span<const lf::assemble::gdof_idx_t> dofarray{
          dofh.GlobalDofIndices(*e)};
      // and print them
      std::cout << *e << ' ' << e_idx << ": " << no_dofs << " dofs = [";
      for (int loc_dof_idx = 0; loc_dof_idx < no_dofs; ++loc_dof_idx) {
        std::cout << dofarray[loc_dof_idx] << ' ';
      }
      std::cout << ']';
      // Also output indices of interior shape functions
      const std::span<const lf::assemble::gdof_idx_t>
	intdofarray{dofh.InteriorGlobalDofIndices(*e)};
      std::cout << " int = [";
      for (const lf::assemble::gdof_idx_t int_dof : intdofarray) {
        std::cout << int_dof << ' ';
      }
      std::cout << ']' << '\n';
    }
  }
  // List entities associated with the dofs managed by the current
  // DofHandler object
  for (lf::assemble::gdof_idx_t dof_idx = 0; dof_idx < N_dofs; dof_idx++) {
    const lf::mesh::Entity &e(dofh.Entity(dof_idx));
    std::cout << "dof " << dof_idx << " -> " << e << " " << mesh->Index(e)
              << '\n';
  }
}